

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::InsertLabels(IRBuilder *this)

{
  code *pcVar1;
  anon_class_32_4_44d1a4de_for_fn fn;
  uint uVar2;
  LabelInstr *this_00;
  bool bVar3;
  uint uVar4;
  uint32 byteCodeOffset;
  BailOutKind kind;
  undefined4 *puVar5;
  Type_conflict node;
  Type *ppBVar6;
  BranchInstr *pBVar7;
  BranchInstr *this_01;
  BranchInstr *backEdgeBranchInstr;
  bool wasLoopTop;
  MultiBranchInstr *local_58;
  MultiBranchInstr *multiBranchInstr;
  uint branchOffset;
  uint offset;
  BranchInstr *branchInstr;
  BranchReloc *reloc;
  LabelInstr *labelInstr;
  Iterator iter;
  IRBuilder *this_local;
  
  iter.current = (NodeBase *)this;
  if (this->branchRelocList == (SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x3c5,"(this->branchRelocList)","Malformed branch reloc list");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)&labelInstr,
             &this->branchRelocList->
              super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>);
  while( true ) {
    if (iter.list == (SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_00 = labelInstr;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar3) break;
    iter.list = (SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    reloc = (BranchReloc *)0x0;
    ppBVar6 = SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&labelInstr);
    branchInstr = (BranchInstr *)*ppBVar6;
    _branchOffset = BranchReloc::GetBranchInstr((BranchReloc *)branchInstr);
    multiBranchInstr._4_4_ = BranchReloc::GetOffset((BranchReloc *)branchInstr);
    multiBranchInstr._0_4_ = BranchReloc::GetBranchOffset((BranchReloc *)branchInstr);
    bVar3 = IsLoopBody(this);
    uVar2 = multiBranchInstr._4_4_;
    if ((bVar3) && (uVar4 = GetLoopBodyExitInstrOffset(this), uVar4 < uVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x3d1,"(!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset())",
                         "!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((_branchOffset->super_Instr).m_opcode == MultiBr) {
      pBVar7 = IR::Instr::AsBranchInstr(&_branchOffset->super_Instr);
      local_58 = IR::BranchInstr::AsMultiBrInstr(pBVar7);
      fn.this = this;
      fn.labelInstr = (LabelInstr **)&reloc;
      fn.branchInstr = (BranchInstr **)&branchOffset;
      fn.multiBranchInstr = &local_58;
      IR::MultiBranchInstr::UpdateMultiBrTargetOffsets<IRBuilder::InsertLabels()::__0>(local_58,fn);
    }
    else {
      reloc = (BranchReloc *)CreateLabel(this,_branchOffset,(uint *)((long)&multiBranchInstr + 4));
      IR::BranchInstr::SetTarget(_branchOffset,(LabelInstr *)reloc);
    }
    bVar3 = BranchReloc::IsNotBackEdge((BranchReloc *)branchInstr);
    if ((!bVar3) && (multiBranchInstr._4_4_ <= (uint32)multiBranchInstr)) {
      pBVar7 = reloc[5].branchInstr;
      *(byte *)&reloc[5].branchInstr = *(byte *)&reloc[5].branchInstr & 0xfe | 1;
      bVar3 = Func::IsJitInDebugMode(this->m_func);
      if (bVar3) {
        this_01 = BranchReloc::GetBranchInstr((BranchReloc *)branchInstr);
        byteCodeOffset = IR::Instr::GetByteCodeOffset(&this_01->super_Instr);
        kind = IR::operator|(BailOutForceByFlag,BailOutBreakPointInFunction);
        InsertBailOutForDebugger(this,byteCodeOffset,kind,&this_01->super_Instr);
      }
      if ((((ulong)pBVar7 & 1) == 0) && (this->m_loopCounterSym != (StackSym *)0x0)) {
        InsertIncrLoopBodyLoopCounter(this,(LabelInstr *)reloc);
      }
    }
  }
  return;
}

Assistant:

void
IRBuilder::InsertLabels()
{
    AssertMsg(this->branchRelocList, "Malformed branch reloc list");

    SList<BranchReloc *>::Iterator iter(this->branchRelocList);

    while (iter.Next())
    {
        IR::LabelInstr * labelInstr = nullptr;
        BranchReloc * reloc = iter.Data();
        IR::BranchInstr * branchInstr = reloc->GetBranchInstr();
        uint offset = reloc->GetOffset();
        uint const branchOffset = reloc->GetBranchOffset();

        Assert(!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset());

        if(branchInstr->m_opcode == Js::OpCode::MultiBr)
        {
            IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsBranchInstr()->AsMultiBrInstr();

            multiBranchInstr->UpdateMultiBrTargetOffsets([&](uint32 offset) -> IR::LabelInstr *
            {
                labelInstr = this->CreateLabel(branchInstr, offset);
                multiBranchInstr->ChangeLabelRef(nullptr, labelInstr);
                return labelInstr;
            });
        }
        else
        {
            labelInstr = this->CreateLabel(branchInstr, offset);
            branchInstr->SetTarget(labelInstr);
        }

        if (!reloc->IsNotBackEdge() && branchOffset >= offset)
        {
            bool wasLoopTop = labelInstr->m_isLoopTop;
            labelInstr->m_isLoopTop = true;

            if (m_func->IsJitInDebugMode())
            {
                // Add bailout for Async Break.
                IR::BranchInstr* backEdgeBranchInstr = reloc->GetBranchInstr();
                this->InsertBailOutForDebugger(backEdgeBranchInstr->GetByteCodeOffset(), IR::BailOutForceByFlag | IR::BailOutBreakPointInFunction, backEdgeBranchInstr);
            }

            if (!wasLoopTop && m_loopCounterSym)
            {
                this->InsertIncrLoopBodyLoopCounter(labelInstr);
            }

        }
    }
}